

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O0

wstring * __thiscall ZXing::Content::utfW_abi_cxx11_(Content *this)

{
  string_view utf8;
  wstring *in_RDI;
  bool in_stack_00000047;
  Content *in_stack_00000048;
  string local_40 [32];
  
  render_abi_cxx11_(in_stack_00000048,in_stack_00000047);
  utf8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
  FromUtf8_abi_cxx11_(utf8);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::wstring Content::utfW() const
{
	return FromUtf8(render(false));
}